

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbe_c.hpp
# Opt level: O1

void ExchCXX::kernel_traits<ExchCXX::BuiltinPBE_C>::eval_exc_vxc_polar_impl
               (double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
               double *eps,double *vrho_a,double *vrho_b,double *vsigma_aa,double *vsigma_ab,
               double *vsigma_bb)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  undefined1 auVar6 [16];
  double dVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  double __x;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  undefined1 auVar46 [16];
  double dVar48;
  double dVar49;
  undefined1 auVar47 [16];
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  double dVar57;
  double dVar58;
  undefined1 auVar59 [16];
  double dVar60;
  double dVar61;
  double dVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  double dVar65;
  double dVar66;
  undefined1 auVar67 [16];
  double dVar68;
  double dVar69;
  undefined1 auVar70 [16];
  double dVar71;
  double dVar72;
  double dVar73;
  undefined1 auVar74 [16];
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  undefined8 uStack_450;
  undefined1 local_408 [16];
  undefined8 local_1c8;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_108;
  undefined8 local_78;
  undefined8 uStack_70;
  
  __x = rho_a + rho_b;
  dVar11 = cbrt(__x);
  dVar31 = 2.4814019635975995 / dVar11;
  dVar13 = SQRT(dVar31);
  dVar12 = dVar13;
  if (dVar31 < 0.0) {
    dVar12 = sqrt(dVar31);
    dVar13 = sqrt(dVar31);
  }
  dVar13 = dVar13 * dVar13 * dVar13;
  dVar44 = 1.5393389262365056 / (dVar11 * dVar11);
  dVar32 = dVar44 * 0.123235 + dVar13 * 0.204775 + dVar12 * 3.79785 + dVar31 * 0.8969;
  dVar14 = 16.081979498692537 / dVar32 + 1.0;
  dVar15 = log(dVar14);
  dVar43 = rho_a - rho_b;
  dVar16 = __x * __x;
  dVar17 = 1.0 / __x;
  dVar18 = dVar43 * dVar17 + 1.0;
  dVar19 = cbrt(1e-15);
  dVar33 = dVar19 * 1e-15;
  local_408._0_8_ = cbrt(dVar18);
  dVar20 = 1.0 - dVar43 * dVar17;
  local_408._8_8_ = cbrt(dVar20);
  dVar34 = dVar44 * 0.1562925 + dVar13 * 0.420775 + dVar12 * 7.05945 + dVar31 * 1.549425;
  dVar21 = 32.16395899738507 / dVar34 + 1.0;
  dVar22 = log(dVar21);
  dVar35 = dVar44 * 0.1241775 + dVar13 * 0.1100325 + dVar12 * 5.1785 + dVar31 * 0.905775;
  dVar23 = 29.608749977793437 / dVar35 + 1.0;
  dVar24 = log(dVar23);
  dVar57 = sigma_ab + sigma_ab + sigma_aa + sigma_bb;
  dVar50 = 1.0 / dVar11;
  auVar67._8_8_ = dVar50;
  auVar67._0_8_ = 0x3ff0000000000000;
  auVar74._8_8_ = __x;
  auVar74._0_8_ = dVar12;
  auVar74 = divpd(auVar67,auVar74);
  dVar75 = auVar74._8_8_ * 1.720508027656199;
  dVar13 = (1.0 / dVar16) * dVar43;
  uVar9 = -(ulong)(dVar18 <= 1e-15);
  uVar10 = -(ulong)(dVar20 <= 1e-15);
  bVar8 = (uVar9 & 1) == 0;
  dVar12 = dVar33;
  if (bVar8) {
    dVar12 = dVar18 * (double)local_408._0_8_;
  }
  dVar60 = auVar74._8_8_ * 2.519842099789747;
  auVar29._8_8_ = dVar35 * dVar35;
  auVar29._0_8_ = dVar23;
  auVar67 = divpd(_DAT_01041040,auVar29);
  dVar18 = dVar31 * 0.0278125 + 1.0;
  dVar23 = dVar17 - dVar13;
  dVar13 = -dVar17 - dVar13;
  dVar17 = 0.0;
  if (bVar8) {
    dVar17 = dVar13 * (double)local_408._0_8_ * 1.3333333333333333;
  }
  dVar51 = dVar60 * 0.9847450218426962;
  dVar35 = auVar74._0_8_ * 1.4422495703074083 * dVar75;
  local_1c8 = auVar67._0_8_;
  dVar11 = 1.0 / (dVar11 * dVar11);
  dVar65 = dVar43 * dVar43;
  dVar28 = dVar57 * (dVar50 / dVar16);
  auVar54._8_4_ = SUB84(dVar57 * dVar57,0);
  auVar54._0_8_ = dVar28;
  auVar54._12_4_ = (int)((ulong)(dVar57 * dVar57) >> 0x20);
  bVar8 = (uVar10 & 1) == 0;
  if (bVar8) {
    dVar33 = dVar20 * (double)local_408._8_8_;
  }
  dVar72 = dVar18 * dVar24;
  uVar5 = ~uVar10 & (ulong)((double)local_408._8_8_ * (double)local_408._8_8_);
  auVar70._0_8_ = (ulong)(dVar19 * dVar19) & uVar9;
  auVar70._8_8_ = (ulong)(dVar19 * dVar19) & uVar10;
  auVar46._8_4_ = (int)uVar5;
  auVar46._0_8_ = ~uVar9 & (ulong)((double)local_408._0_8_ * (double)local_408._0_8_);
  auVar46._12_4_ = (int)(uVar5 >> 0x20);
  dVar20 = SUB168(auVar70 | auVar46,8) * 0.5 + SUB168(auVar70 | auVar46,0) * 0.5;
  dVar61 = dVar20 * dVar20;
  auVar6._8_8_ = dVar61 * dVar61;
  auVar6._0_8_ = dVar61;
  auVar74 = divpd(_DAT_01041040,auVar6);
  dVar19 = dVar16 * dVar16;
  dVar68 = __x * dVar19;
  dVar71 = dVar11 / dVar19;
  auVar4._8_4_ = SUB84(dVar68,0);
  auVar4._0_8_ = dVar19;
  auVar4._12_4_ = (int)((ulong)dVar68 >> 0x20);
  auVar46 = divpd(_DAT_01041040,auVar4);
  dVar19 = dVar65 * dVar65 * auVar46._0_8_;
  auVar29 = divpd(_DAT_01041040,local_408);
  dVar25 = auVar29._0_8_ * 0.6666666666666666;
  dVar30 = auVar29._8_8_ * 0.6666666666666666;
  dVar26 = (double)(~uVar10 & (ulong)(-dVar23 * dVar30 * 0.5)) +
           (double)(~uVar9 & (ulong)(dVar23 * dVar25 * 0.5));
  dVar48 = auVar74._8_8_;
  dVar62 = dVar20 * dVar61;
  dVar36 = dVar62 * 0.031090690869654894;
  dVar76 = auVar74._0_8_ * 2.080083823051904 * 2.3248947030192535;
  dVar78 = dVar71 * 1.5874010519681996 * dVar48 * 7.795554179441513;
  dVar37 = 1.0 / dVar62;
  uStack_450 = auVar54._8_8_;
  dVar7 = uStack_450;
  dVar38 = dVar37 * 1.2599210498948732 * dVar28;
  dVar20 = (dVar48 / dVar20) * 1.5874010519681996 * 1.4422495703074083 * 5.405135380126985;
  dVar73 = (dVar50 / (dVar16 * __x)) * dVar57 * 0.024305555555555556 * -1.2599210498948732 * dVar76;
  dVar39 = 0.0;
  if (bVar8) {
    dVar39 = (double)local_408._8_8_ * 1.3333333333333333 * -dVar13;
  }
  dVar40 = dVar15 * dVar51 * 0.0011073470983333333;
  dVar44 = dVar44 / __x;
  dVar69 = dVar48 * 1.5874010519681996 * 1.4422495703074083;
  dVar77 = (dVar39 + dVar17) * 1.9236610509315362;
  dVar79 = (dVar12 + dVar33 + -2.0) * 1.9236610509315362;
  dVar12 = dVar79 * 0.0197516734986138 * dVar72;
  dVar33 = dVar31 * 0.053425 + 1.0;
  dVar15 = dVar33 * 0.0621814 * dVar15;
  auVar1._8_8_ = dVar14;
  auVar1._0_8_ = dVar32 * dVar32;
  auVar54 = divpd(_DAT_01041040,auVar1);
  dVar41 = ((double)(~uVar10 & (ulong)((double)local_408._8_8_ * 1.3333333333333333 * -dVar23)) +
           (double)(~uVar9 & (ulong)((double)local_408._0_8_ * 1.3333333333333333 * dVar23))) *
           1.9236610509315362;
  dVar52 = dVar31 * 0.05137 + 1.0;
  auVar55._8_8_ = dVar21;
  auVar55._0_8_ = dVar34 * dVar34;
  auVar29 = divpd(_DAT_01041040,auVar55);
  dVar32 = dVar72 * -0.0197516734986138 + dVar52 * -0.0310907 * dVar22 + dVar15;
  dVar17 = dVar32 * dVar79;
  dVar34 = dVar19 * dVar17;
  dVar39 = (dVar34 - dVar15) + dVar12;
  dVar21 = dVar39 * 32.16396844291482;
  dVar27 = exp(-dVar21 * dVar37);
  dVar14 = dVar27 + -1.0;
  dVar66 = 1.0 / (dVar14 * dVar14);
  dVar45 = auVar46._0_8_ * dVar65 * dVar43 * dVar17 * 4.0;
  dVar49 = auVar46._8_8_ * dVar65 * dVar65 * dVar17 * 4.0;
  dVar23 = dVar79 * 1.4422495703074083 * dVar75 * dVar24 * 0.00018311447306006544;
  dVar53 = uStack_450 * dVar66 * 2.1461263399673647 * dVar71;
  dVar58 = (double)(~uVar10 & (ulong)(-dVar13 * dVar30 * 0.5)) +
           (double)(~uVar9 & (ulong)(dVar13 * dVar25 * 0.5));
  dVar13 = (dVar50 / dVar16) * 1.2599210498948732 * auVar74._0_8_ * 4.83597586204941;
  auVar56._8_8_ = 0x3ff0000000000000;
  auVar56._0_8_ = dVar13;
  auVar2._8_8_ = dVar14;
  auVar2._0_8_ = 0x4058000000000000;
  auVar74 = divpd(auVar56,auVar2);
  dVar42 = auVar74._8_8_;
  dVar14 = dVar42 * 32.16396844291482 * 0.06672455060314922;
  uStack_450 = uStack_450 * dVar14;
  auVar3._8_4_ = SUB84(uStack_450,0);
  auVar3._0_8_ = dVar28 * 1.2599210498948732;
  auVar3._12_4_ = (int)((ulong)uStack_450 >> 0x20);
  auVar63._0_8_ = dVar76 * dVar28 * 1.2599210498948732;
  auVar63._8_8_ = dVar78 * uStack_450;
  auVar46 = divpd(auVar63,_DAT_010411e0);
  dVar65 = auVar46._8_8_ + auVar46._0_8_;
  dVar16 = dVar42 * 2.1461263399673647;
  dVar17 = dVar16 * dVar65 + 1.0;
  dVar43 = (1.0 / dVar17) * 32.16396844291482;
  dVar21 = dVar21 * 3.0;
  dVar66 = dVar66 * -2.1461263399673647;
  dVar25 = dVar65 * 0.06672455060314922;
  dVar30 = dVar25 * dVar43 + 1.0;
  dVar50 = log(dVar30);
  dVar28 = dVar50 * dVar36;
  if (dVar31 < 0.0) {
    dVar31 = sqrt(dVar31);
  }
  else {
    dVar31 = SQRT(dVar31);
  }
  dVar75 = dVar75 * dVar31 * 1.4422495703074083;
  local_138 = auVar54._0_8_;
  uStack_130 = auVar54._8_8_;
  dVar33 = (dVar44 * -0.08215666666666667 +
           dVar75 * -0.1023875 + dVar35 * -0.632975 + dVar51 * -0.29896666666666666) * uStack_130 *
           dVar33 * local_138;
  local_78 = auVar29._0_8_;
  uStack_70 = auVar29._8_8_;
  dVar31 = dVar44 * -0.082785 +
           dVar75 * -0.05501625 + dVar35 * -0.8630833333333333 + dVar51 * -0.301925;
  dVar76 = dVar33 + dVar40;
  dVar35 = (dVar60 * 0.00018032106577324796 * dVar24 +
            (((dVar60 * 0.0005242550290131881 * dVar22 +
              (dVar44 * -0.104195 + dVar75 * -0.2103875 + dVar35 * -1.176575 + dVar51 * -0.516475) *
              uStack_70 * dVar52 * local_78) - dVar40) - dVar33) +
           dVar18 * auVar67._8_8_ * 0.5848223622634646 * local_1c8 * dVar31) * dVar79 * dVar19;
  dVar18 = dVar18 * dVar79 * auVar67._8_8_ * dVar31 * local_1c8 * 0.5848223622634646;
  dVar24 = ((dVar32 * dVar41 * dVar19 + ((dVar45 + dVar76) - dVar49) + dVar35 +
            dVar41 * dVar72 * 0.0197516734986138) - dVar23) - dVar18;
  dVar33 = dVar26 * dVar48 * dVar21 + dVar24 * -32.16396844291482 * dVar37;
  uStack_450 = auVar3._8_8_;
  dVar31 = uStack_450 * 0.0015190972222222222 *
           (dVar11 / dVar68) * 1.5874010519681996 * dVar48 * 7.795554179441513;
  dVar71 = dVar71 * dVar7 * dVar42 * 2.1461263399673647;
  dVar22 = (((dVar73 - (dVar26 * 1.5874010519681996 * 3.0464738926897783 * dVar38) / 48.0) -
            (dVar27 * dVar33 * 5.405135380126985 * dVar69 * dVar53) / 3072.0) - dVar31) -
           (dVar26 * dVar20 * dVar71) / 768.0;
  dVar78 = dVar57 * dVar14 * dVar78;
  auVar64._8_8_ = dVar17 * dVar17;
  auVar64._0_8_ = 0x4098000000000000;
  auVar59._8_8_ = 0x3ff0000000000000;
  auVar59._0_8_ = dVar78;
  auVar67 = divpd(auVar59,auVar64);
  dVar44 = auVar67._8_8_ * 32.16396844291482;
  dVar30 = 1.0 / dVar30;
  dVar18 = ((dVar32 * dVar77 * dVar19 + ((dVar76 - dVar45) - dVar49) + dVar35 +
            dVar72 * dVar77 * 0.0197516734986138) - dVar23) - dVar18;
  dVar11 = dVar48 * dVar58 * dVar21 + dVar18 * -32.16396844291482 * dVar37;
  dVar14 = (((dVar73 - (dVar58 * 1.5874010519681996 * 3.0464738926897783 * dVar38) / 48.0) -
            (dVar27 * dVar11 * 5.405135380126985 * dVar69 * dVar53) / 3072.0) - dVar31) -
           (dVar71 * dVar20 * dVar58) / 768.0;
  local_108 = auVar74._0_8_;
  dVar42 = dVar42 * auVar67._8_8_;
  local_108 = auVar67._0_8_ + local_108;
  dVar31 = dVar65 * 0.004452165653192221 * -1034.5208659968205;
  auVar47._8_8_ = dVar78;
  auVar47._0_8_ = dVar13;
  auVar74 = divpd(auVar47,_DAT_01041450);
  dVar13 = auVar74._8_8_ + auVar74._0_8_;
  *eps = dVar39 + dVar28;
  *vrho_a = (((dVar24 + dVar26 * dVar50 * dVar61 * 0.031090690869654894 * 3.0 +
              (dVar22 * 0.06672455060314922 * dVar43 -
              (dVar33 * dVar65 * dVar66 * dVar27 + dVar22 * dVar16) * dVar44 * dVar25) * dVar30 *
              dVar36) * __x + dVar28) - dVar15) + dVar34 + dVar12;
  *vrho_b = (((dVar18 + dVar58 * dVar50 * dVar61 * 0.031090690869654894 * 3.0 +
              (dVar14 * 0.06672455060314922 * dVar43 -
              (dVar11 * dVar65 * dVar66 * dVar27 + dVar16 * dVar14) * dVar44 * dVar25) * dVar30 *
              dVar36) * __x + dVar28) - dVar15) + dVar34 + dVar12;
  *vsigma_aa = dVar62 * __x * 0.031090690869654894 *
               (local_108 * 0.06672455060314922 * dVar43 + local_108 * dVar42 * dVar31) * dVar30;
  *vsigma_ab = (dVar13 * 0.06672455060314922 * dVar43 + dVar13 * dVar42 * dVar31) * dVar62 *
               __x * 0.031090690869654894 * dVar30;
  *vsigma_bb = *vsigma_aa;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_polar_impl( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double& eps, double& vrho_a, double& vrho_b, double& vsigma_aa, double& vsigma_ab, double& vsigma_bb ) {

    (void)(eps);
    constexpr double t1 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_one_ov_pi;
    constexpr double t5 = constants::m_cbrt_4;
    constexpr double t56 = constants::m_cbrt_2;
    constexpr double t4 = t1 * t3;
    constexpr double t6 = t5 * t5;
    constexpr double t19 = t1 * t1;
    constexpr double t20 = t3 * t3;
    constexpr double t21 = t19 * t20;
    constexpr double t110 = 0.1e1 / t3;
    constexpr double t111 = t110 * t5;
    constexpr double t115 = BB * beta;
    constexpr double t116 = 0.1e1 / gamma;
    constexpr double t130 = t56 * t56;
    constexpr double t135 = 0.1e1 / t20;
    constexpr double t136 = t1 * t135;
    constexpr double t137 = t136 * t6;
    constexpr double t143 = beta * t116;
    constexpr double t164 = t3 * t6;
    constexpr double t275 = t19 * t110;
    constexpr double t280 = t115 * t116;
    constexpr double t288 = t135 * t6;
    constexpr double t404 = t275 * t5;
    constexpr double t414 = beta * beta;
    constexpr double t416 = gamma * gamma;
    constexpr double t417 = 0.1e1 / t416;


    const double t7 = rho_a + rho_b;
    const double t8 = safe_math::cbrt( t7 );
    const double t11 = t4 * t6 / t8;
    const double t13 = 0.1e1 + 0.53425e-1 * t11;
    const double t14 = safe_math::sqrt( t11 );
    const double t17 = pow_3_2( t11 );
    const double t22 = t8 * t8;
    const double t25 = t21 * t5 / t22;
    const double t27 = 0.379785e1 * t14 + 0.8969e0 * t11 + 0.204775e0 * t17 + 0.123235e0 * t25;
    const double t30 = 0.1e1 + 0.16081979498692535067e2 / t27;
    const double t31 = safe_math::log( t30 );
    const double t33 = 0.621814e-1 * t13 * t31;
    const double t34 = rho_a - rho_b;
    const double t35 = t34 * t34;
    const double t36 = t35 * t35;
    const double t37 = t7 * t7;
    const double t38 = t37 * t37;
    const double t39 = 0.1e1 / t38;
    const double t40 = t36 * t39;
    const double t41 = 0.1e1 / t7;
    const double t42 = t34 * t41;
    const double t43 = 0.1e1 + t42;
    const double t44 = t43 <= zeta_tol;
    const double t45 = safe_math::cbrt( zeta_tol );
    const double t46 = t45 * zeta_tol;
    const double t47 = safe_math::cbrt( t43 );
    const double t48 = t47 * t43;
    const double t49 = piecewise_functor_3( t44, t46, t48 );
    const double t50 = 0.1e1 - t42;
    const double t51 = t50 <= zeta_tol;
    const double t52 = safe_math::cbrt( t50 );
    const double t53 = t52 * t50;
    const double t54 = piecewise_functor_3( t51, t46, t53 );
    const double t55 = t49 + t54 - 0.2e1;
    const double t59 = 0.1e1 / ( 0.2e1 * t56 - 0.2e1 );
    const double t60 = t55 * t59;
    const double t62 = 0.1e1 + 0.5137e-1 * t11;
    const double t67 = 0.705945e1 * t14 + 0.1549425e1 * t11 + 0.420775e0 * t17 + 0.1562925e0 * t25;
    const double t70 = 0.1e1 + 0.32163958997385070134e2 / t67;
    const double t71 = safe_math::log( t70 );
    const double t75 = 0.1e1 + 0.278125e-1 * t11;
    const double t80 = 0.51785e1 * t14 + 0.905775e0 * t11 + 0.1100325e0 * t17 + 0.1241775e0 * t25;
    const double t83 = 0.1e1 + 0.29608749977793437516e2 / t80;
    const double t84 = safe_math::log( t83 );
    const double t85 = t75 * t84;
    const double t87 = -0.310907e-1 * t62 * t71 + t33 - 0.19751673498613801407e-1 * t85;
    const double t88 = t60 * t87;
    const double t89 = t40 * t88;
    const double t91 = 0.19751673498613801407e-1 * t60 * t85;
    const double t92 = t45 * t45;
    const double t93 = t47 * t47;
    const double t94 = piecewise_functor_3( t44, t92, t93 );
    const double t95 = t52 * t52;
    const double t96 = piecewise_functor_3( t51, t92, t95 );
    const double t98 = t94 / 0.2e1 + t96 / 0.2e1;
    const double t99 = t98 * t98;
    const double t100 = t99 * t98;
    const double t101 = gamma * t100;
    const double t103 = sigma_aa + 0.2e1 * sigma_ab + sigma_bb;
    const double t105 = 0.1e1 / t8 / t37;
    const double t106 = t103 * t105;
    const double t108 = 0.1e1 / t99;
    const double t112 = t108 * t19 * t111;
    const double t118 = ( -t33 + t89 + t91 ) * t116;
    const double t119 = 0.1e1 / t100;
    const double t121 = safe_math::exp( -t118 * t119 );
    const double t122 = t121 - 0.1e1;
    const double t123 = 0.1e1 / t122;
    const double t124 = t116 * t123;
    const double t125 = t103 * t103;
    const double t127 = t115 * t124 * t125;
    const double t129 = 0.1e1 / t22 / t38;
    const double t131 = t129 * t130;
    const double t132 = t99 * t99;
    const double t133 = 0.1e1 / t132;
    const double t134 = t131 * t133;
    const double t138 = t134 * t137;
    const double t141 = t106 * t56 * t112 / 0.96e2 + t127 * t138 / 0.3072e4;
    const double t142 = beta * t141;
    const double t146 = t143 * t123 * t141 + 0.1e1;
    const double t147 = 0.1e1 / t146;
    const double t148 = t116 * t147;
    const double t150 = t142 * t148 + 0.1e1;
    const double t151 = safe_math::log( t150 );
    const double t152 = t101 * t151;
    const double t154 = 0.1e1 / t8 / t7;
    const double t155 = t6 * t154;
    const double t157 = t4 * t155 * t31;
    const double t158 = 0.11073470983333333333e-2 * t157;
    const double t159 = t27 * t27;
    const double t160 = 0.1e1 / t159;
    const double t161 = t13 * t160;
    const double t163 = 0.1e1 / t14 * t1;
    const double t165 = t164 * t154;
    const double t166 = t163 * t165;
    const double t168 = t4 * t155;
    const double t170 = safe_math::sqrt( t11 );
    const double t171 = t170 * t1;
    const double t172 = t171 * t165;
    const double t177 = t21 * t5 / t22 / t7;
    const double t179 = -0.632975e0 * t166 - 0.29896666666666666667e0 * t168 - 0.1023875e0 * t172 - 0.82156666666666666667e-1 * t177;
    const double t180 = 0.1e1 / t30;
    const double t181 = t179 * t180;
    const double t182 = t161 * t181;
    const double t183 = 0.1e1 * t182;
    const double t184 = t35 * t34;
    const double t185 = t184 * t39;
    const double t186 = t185 * t88;
    const double t187 = 0.4e1 * t186;
    const double t188 = t38 * t7;
    const double t189 = 0.1e1 / t188;
    const double t190 = t36 * t189;
    const double t191 = t190 * t88;
    const double t192 = 0.4e1 * t191;
    const double t193 = 0.1e1 / t37;
    const double t194 = t34 * t193;
    const double t195 = t41 - t194;
    const double t198 = piecewise_functor_3( t44, 0.0, 0.4e1 / 0.3e1 * t47 * t195 );
    const double t199 = -t195;
    const double t202 = piecewise_functor_3( t51, 0.0, 0.4e1 / 0.3e1 * t52 * t199 );
    const double t204 = ( t198 + t202 ) * t59;
    const double t205 = t204 * t87;
    const double t206 = t40 * t205;
    const double t210 = t67 * t67;
    const double t211 = 0.1e1 / t210;
    const double t212 = t62 * t211;
    const double t217 = -0.1176575e1 * t166 - 0.516475e0 * t168 - 0.2103875e0 * t172 - 0.104195e0 * t177;
    const double t218 = 0.1e1 / t70;
    const double t219 = t217 * t218;
    const double t225 = t80 * t80;
    const double t226 = 0.1e1 / t225;
    const double t227 = t75 * t226;
    const double t232 = -0.86308333333333333334e0 * t166 - 0.301925e0 * t168 - 0.5501625e-1 * t172 - 0.82785e-1 * t177;
    const double t233 = 0.1e1 / t83;
    const double t234 = t232 * t233;
    const double t237 = 0.53237641966666666666e-3 * t4 * t155 * t71 + 0.1e1 * t212 * t219 - t158 - t183 + 0.18311447306006545054e-3 * t4 * t155 * t84 + 0.5848223622634646207e0 * t227 * t234;
    const double t238 = t60 * t237;
    const double t239 = t40 * t238;
    const double t240 = t204 * t85;
    const double t241 = 0.19751673498613801407e-1 * t240;
    const double t242 = t60 * t1;
    const double t244 = t164 * t154 * t84;
    const double t245 = t242 * t244;
    const double t246 = 0.18311447306006545054e-3 * t245;
    const double t247 = t60 * t75;
    const double t249 = t226 * t232 * t233;
    const double t250 = t247 * t249;
    const double t251 = 0.5848223622634646207e0 * t250;
    const double t252 = gamma * t99;
    const double t253 = 0.1e1 / t47;
    const double t256 = piecewise_functor_3( t44, 0.0, 0.2e1 / 0.3e1 * t253 * t195 );
    const double t257 = 0.1e1 / t52;
    const double t260 = piecewise_functor_3( t51, 0.0, 0.2e1 / 0.3e1 * t257 * t199 );
    const double t262 = t256 / 0.2e1 + t260 / 0.2e1;
    const double t263 = t151 * t262;
    const double t264 = t252 * t263;
    const double t265 = 0.3e1 * t264;
    const double t266 = t37 * t7;
    const double t268 = 0.1e1 / t8 / t266;
    const double t269 = t103 * t268;
    const double t272 = 0.7e1 / 0.288e3 * t269 * t56 * t112;
    const double t273 = t56 * t119;
    const double t274 = t106 * t273;
    const double t276 = t5 * t262;
    const double t277 = t275 * t276;
    const double t281 = t122 * t122;
    const double t282 = 0.1e1 / t281;
    const double t283 = t282 * t125;
    const double t285 = t280 * t283 * t129;
    const double t286 = t130 * t133;
    const double t287 = t286 * t1;
    const double t290 = ( t158 + t183 + t187 - t192 + t206 + t239 + t241 - t246 - t251 ) * t116;
    const double t292 = t133 * t262;
    const double t295 = 0.3e1 * t118 * t292 - t290 * t119;
    const double t296 = t295 * t121;
    const double t297 = t288 * t296;
    const double t298 = t287 * t297;
    const double t302 = 0.1e1 / t22 / t188;
    const double t303 = t302 * t130;
    const double t304 = t303 * t133;
    const double t305 = t304 * t137;
    const double t307 = 0.7e1 / 0.4608e4 * t127 * t305;
    const double t308 = t123 * t125;
    const double t310 = t280 * t308 * t129;
    const double t312 = 0.1e1 / t132 / t98;
    const double t313 = t130 * t312;
    const double t314 = t313 * t1;
    const double t316 = t314 * t288 * t262;
    const double t319 = -t272 - t274 * t277 / 0.48e2 - t285 * t298 / 0.3072e4 - t307 - t310 * t316 / 0.768e3;
    const double t320 = beta * t319;
    const double t322 = t146 * t146;
    const double t323 = 0.1e1 / t322;
    const double t324 = t116 * t323;
    const double t325 = t143 * t282;
    const double t326 = t141 * t295;
    const double t331 = -t325 * t326 * t121 + t143 * t123 * t319;
    const double t332 = t324 * t331;
    const double t334 = -t142 * t332 + t320 * t148;
    const double t335 = 0.1e1 / t150;
    const double t336 = t334 * t335;
    const double t337 = t101 * t336;
    const double t338 = t158 + t183 + t187 - t192 + t206 + t239 + t241 - t246 - t251 + t265 + t337;
    const double t340 = -t41 - t194;
    const double t343 = piecewise_functor_3( t44, 0.0, 0.4e1 / 0.3e1 * t47 * t340 );
    const double t344 = -t340;
    const double t347 = piecewise_functor_3( t51, 0.0, 0.4e1 / 0.3e1 * t52 * t344 );
    const double t349 = ( t343 + t347 ) * t59;
    const double t350 = t349 * t87;
    const double t351 = t40 * t350;
    const double t352 = t349 * t85;
    const double t353 = 0.19751673498613801407e-1 * t352;
    const double t356 = piecewise_functor_3( t44, 0.0, 0.2e1 / 0.3e1 * t253 * t340 );
    const double t359 = piecewise_functor_3( t51, 0.0, 0.2e1 / 0.3e1 * t257 * t344 );
    const double t361 = t356 / 0.2e1 + t359 / 0.2e1;
    const double t362 = t151 * t361;
    const double t363 = t252 * t362;
    const double t364 = 0.3e1 * t363;
    const double t365 = t5 * t361;
    const double t366 = t275 * t365;
    const double t370 = ( t158 + t183 - t187 - t192 + t351 + t239 + t353 - t246 - t251 ) * t116;
    const double t372 = t133 * t361;
    const double t375 = 0.3e1 * t118 * t372 - t370 * t119;
    const double t376 = t375 * t121;
    const double t377 = t288 * t376;
    const double t378 = t287 * t377;
    const double t382 = t314 * t288 * t361;
    const double t385 = -t272 - t274 * t366 / 0.48e2 - t285 * t378 / 0.3072e4 - t307 - t310 * t382 / 0.768e3;
    const double t386 = beta * t385;
    const double t388 = t141 * t375;
    const double t393 = -t325 * t388 * t121 + t143 * t123 * t385;
    const double t394 = t324 * t393;
    const double t396 = -t142 * t394 + t386 * t148;
    const double t397 = t396 * t335;
    const double t398 = t101 * t397;
    const double t399 = t158 + t183 - t187 - t192 + t351 + t239 + t353 - t246 - t251 + t364 + t398;
    const double t401 = t7 * gamma;
    const double t402 = t105 * t56;
    const double t405 = t402 * t108 * t404;
    const double t408 = t115 * t124 * t103;
    const double t409 = t408 * t138;
    const double t411 = t405 / 0.96e2 + t409 / 0.1536e4;
    const double t412 = beta * t411;
    const double t415 = t414 * t141;
    const double t418 = t415 * t417;
    const double t419 = t323 * t123;
    const double t420 = t419 * t411;
    const double t422 = t412 * t148 - t418 * t420;
    const double t427 = t405 / 0.48e2 + t409 / 0.768e3;
    const double t428 = beta * t427;
    const double t430 = t419 * t427;
    const double t432 = t428 * t148 - t418 * t430;
    const double t433 = t100 * t432;


    eps = -t33 + t89 + t91 + t152;
    vrho_a = t7 * t338 + t152 - t33 + t89 + t91;
    vrho_b = t7 * t399 + t152 - t33 + t89 + t91;
    vsigma_aa = t401 * t100 * t422 * t335;
    vsigma_ab = t401 * t433 * t335;
    vsigma_bb = vsigma_aa;

  }